

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::NewArrayExpression::fromSyntax
          (Compilation *compilation,NewArrayExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *pEVar1;
  ParenthesizedExpressionSyntax *this;
  bool bVar2;
  Type *pTVar3;
  Expression *pEVar4;
  SourceLocation location;
  NewArrayExpression *expr;
  SourceRange sourceRange;
  Expression *initExpr;
  Expression *local_48;
  Token local_40;
  
  if (assignmentTarget != (Type *)0x0) {
    pTVar3 = assignmentTarget->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar3 = assignmentTarget->canonical;
    }
    if ((pTVar3->super_Symbol).kind == DynamicArrayType) {
      pEVar1 = (syntax->sizeExpr).ptr;
      if (pEVar1 != (ExpressionSyntax *)0x0) {
        pEVar4 = Expression::selfDetermined
                           (compilation,pEVar1,context,(bitmask<slang::ast::ASTFlags>)0x0);
        local_48 = (Expression *)0x0;
        this = syntax->initializer;
        if (this != (ParenthesizedExpressionSyntax *)0x0) {
          pEVar1 = (this->expression).ptr;
          if (pEVar1 == (ExpressionSyntax *)0x0) goto LAB_003a77be;
          local_40 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)this);
          location = parsing::Token::location(&local_40);
          local_48 = Expression::bindRValue
                               (assignmentTarget,pEVar1,location,context,
                                (bitmask<slang::ast::ASTFlags>)0x0);
        }
        local_40 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        expr = BumpAllocator::
               emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,assignmentTarget,pEVar4,&local_48,
                          (SourceRange *)&local_40);
        bVar2 = Expression::bad(pEVar4);
        if ((!bVar2) &&
           (((local_48 == (Expression *)0x0 || (bVar2 = Expression::bad(local_48), !bVar2)) &&
            (bVar2 = ASTContext::requireIntegral(context,pEVar4), bVar2)))) {
          return &expr->super_Expression;
        }
        pEVar4 = Expression::badExpr(compilation,&expr->super_Expression);
        return pEVar4;
      }
LAB_003a77be:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                );
    }
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0x6b0007,sourceRange);
  pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar4;
}

Assistant:

Expression& NewArrayExpression::fromSyntax(Compilation& compilation,
                                           const NewArrayExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    if (!assignmentTarget ||
        assignmentTarget->getCanonicalType().kind != SymbolKind::DynamicArrayType) {
        context.addDiag(diag::NewArrayTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto& sizeExpr = selfDetermined(compilation, *syntax.sizeExpr, context);
    const Expression* initExpr = nullptr;
    if (syntax.initializer) {
        initExpr = &bindRValue(*assignmentTarget, *syntax.initializer->expression,
                               syntax.initializer->getFirstToken().location(), context);
    }

    auto result = compilation.emplace<NewArrayExpression>(*assignmentTarget, sizeExpr, initExpr,
                                                          syntax.sourceRange());
    if (sizeExpr.bad() || (initExpr && initExpr->bad()))
        return badExpr(compilation, result);

    if (!context.requireIntegral(sizeExpr))
        return badExpr(compilation, result);

    return *result;
}